

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingCompressionState<short,_true,_short>::FlushSegment
          (BitpackingCompressionState<short,_true,_short> *this)

{
  bool bVar1;
  undefined8 uVar2;
  BitpackingCompressionState<short,_true,_short> *in_RDI;
  idx_t total_segment_size;
  idx_t metadata_size;
  idx_t metadata_offset;
  idx_t unaligned_offset;
  data_ptr_t base_ptr;
  ColumnCheckpointState *state;
  string *in_stack_ffffffffffffff28;
  InternalException *in_stack_ffffffffffffff30;
  ColumnCheckpointState *this_00;
  idx_t in_stack_ffffffffffffff50;
  allocator *paVar3;
  data_ptr_t data_bytes;
  undefined1 local_98 [24];
  undefined1 local_80 [8];
  unsigned_long local_78;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  long local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  data_ptr_t local_18;
  ColumnCheckpointState *local_10;
  
  local_10 = ColumnDataCheckpointData::GetCheckpointState((ColumnDataCheckpointData *)0xa7c695);
  local_18 = BufferHandle::Ptr((BufferHandle *)0xa7c6ab);
  local_20 = NumericCast<unsigned_long,long,void>(0xa7c6cf);
  local_28 = AlignValue<unsigned_long,_8UL>(local_20);
  data_bytes = local_18;
  CompressionInfo::GetBlockSize((CompressionInfo *)0xa7c707);
  local_30 = NumericCast<unsigned_long,long,void>(0xa7c723);
  local_38 = local_28 + local_30;
  bVar1 = CanStore(in_RDI,(idx_t)data_bytes,in_stack_ffffffffffffff50);
  if (!bVar1) {
    local_6d = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    paVar3 = &local_59;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"Error in bitpacking size calculation",paVar3);
    InternalException::InternalException(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_6d = 0;
    __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
  }
  if (local_20 != local_28) {
    memset(local_18 + local_20,0,local_28 - local_20);
  }
  memmove(local_18 + local_28,in_RDI->metadata_ptr,local_30);
  local_78 = local_28 + local_30;
  Store<unsigned_long>(&local_78,local_18);
  this_00 = local_10;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             local_10,(unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffff28);
  BufferHandle::BufferHandle((BufferHandle *)this_00,(BufferHandle *)in_stack_ffffffffffffff28);
  (*this_00->_vptr_ColumnCheckpointState[4])(this_00,local_80,local_98,local_38);
  BufferHandle::~BufferHandle((BufferHandle *)this_00);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa7c91c);
  return;
}

Assistant:

void FlushSegment() {
		auto &state = checkpoint_data.GetCheckpointState();
		auto base_ptr = handle.Ptr();

		// Compact the segment by moving the metadata next to the data.

		idx_t unaligned_offset = NumericCast<idx_t>(data_ptr - base_ptr);
		idx_t metadata_offset = AlignValue(unaligned_offset);
		idx_t metadata_size = NumericCast<idx_t>(base_ptr + info.GetBlockSize() - metadata_ptr);
		idx_t total_segment_size = metadata_offset + metadata_size;

		// Asserting things are still sane here
		if (!CanStore(0, 0)) {
			throw InternalException("Error in bitpacking size calculation");
		}

		if (unaligned_offset != metadata_offset) {
			// zero initialize any padding bits
			memset(base_ptr + unaligned_offset, 0, metadata_offset - unaligned_offset);
		}
		memmove(base_ptr + metadata_offset, metadata_ptr, metadata_size);

		// Store the offset of the metadata of the first group (which is at the highest address).
		Store<idx_t>(metadata_offset + metadata_size, base_ptr);

		state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
	}